

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGen::Tools_abi_cxx11_
          (string *__return_storage_ptr__,cmQtAutoGen *this,bool moc,bool uic,bool rcc)

{
  reference pvVar1;
  int iVar2;
  ulong __n;
  size_type __n_00;
  bool bVar4;
  allocator<char> local_49;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL> lst;
  size_type sVar3;
  
  lst._M_elems[2]._M_len = 0;
  lst._M_elems[2]._M_str = (char *)0x0;
  lst._M_elems[1]._M_len = 0;
  lst._M_elems[1]._M_str = (char *)0x0;
  lst._M_elems[0]._M_len = 0;
  lst._M_elems[0]._M_str = (char *)0x0;
  bVar4 = (int)this != 0;
  if (bVar4) {
    lst._M_elems[0]._M_len = 7;
    lst._M_elems[0]._M_str = "AUTOMOC";
  }
  __n = (ulong)bVar4;
  __n_00 = __n;
  if (moc) {
    __n_00 = __n + 1;
    pvVar1 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::at(&lst,__n);
    pvVar1->_M_len = 7;
    pvVar1->_M_str = "AUTOUIC";
  }
  sVar3 = __n_00;
  if (uic) {
    sVar3 = __n_00 + 1;
    pvVar1 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_3UL>::at(&lst,__n_00)
    ;
    pvVar1->_M_len = 7;
    pvVar1->_M_str = "AUTORCC";
  }
  iVar2 = (int)sVar3;
  if (iVar2 == 3) {
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6],std::basic_string_view<char,std::char_traits<char>>&>
              (__return_storage_ptr__,lst._M_elems,(char (*) [3])0x7b70f1,lst._M_elems + 1,
               (char (*) [6])" and ",lst._M_elems + 2);
  }
  else if (iVar2 == 2) {
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6],std::basic_string_view<char,std::char_traits<char>>&>
              (__return_storage_ptr__,lst._M_elems,(char (*) [6])" and ",lst._M_elems + 1);
  }
  else if (iVar2 == 1) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,lst._M_elems,&local_49);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Tools(bool moc, bool uic, bool rcc)
{
  std::array<cm::string_view, 3> lst;
  decltype(lst)::size_type num = 0;
  if (moc) {
    lst.at(num++) = "AUTOMOC";
  }
  if (uic) {
    lst.at(num++) = "AUTOUIC";
  }
  if (rcc) {
    lst.at(num++) = "AUTORCC";
  }
  switch (num) {
    case 1:
      return std::string(lst[0]);
    case 2:
      return cmStrCat(lst[0], " and ", lst[1]);
    case 3:
      return cmStrCat(lst[0], ", ", lst[1], " and ", lst[2]);
    default:
      break;
  }
  return std::string();
}